

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall amrex::EB2::Level::fillBndryNorm(Level *this,MultiCutFab *bndrynorm,Geometry *geom)

{
  MultiFab tmp;
  FabFactory<amrex::FArrayBox> local_1c8;
  MFInfo local_1c0;
  MultiFab local_198;
  
  if (this->m_allregular == true) {
    MultiCutFab::setVal(bndrynorm,0.0);
    return;
  }
  local_1c0.alloc = true;
  local_1c0._1_7_ = 0;
  local_1c0.arena = (Arena *)0x0;
  local_1c0.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c0.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_007d2928;
  MultiFab::MultiFab(&local_198,&(bndrynorm->m_data).super_FabArrayBase.boxarray,
                     &(bndrynorm->m_data).super_FabArrayBase.distributionMap,
                     (bndrynorm->m_data).super_FabArrayBase.n_comp,
                     (bndrynorm->m_data).super_FabArrayBase.n_grow.vect[0],&local_1c0,&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  fillBndryNorm(this,&local_198,geom);
  anon_unknown_2::copyMultiFabToMultiCutFab(bndrynorm,&local_198);
  MultiFab::~MultiFab(&local_198);
  return;
}

Assistant:

void
Level::fillBndryNorm (MultiCutFab& bndrynorm, const Geometry& geom) const
{
    if (isAllRegular()) {
        bndrynorm.setVal(0.0);
        return;
    }

    MultiFab tmp(bndrynorm.boxArray(), bndrynorm.DistributionMap(),
                 bndrynorm.nComp(), bndrynorm.nGrow());
    fillBndryNorm(tmp, geom);
    copyMultiFabToMultiCutFab(bndrynorm, tmp);
}